

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ROIAlign_x86_avx512::forward
          (ROIAlign_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  int *piVar2;
  reference pvVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_type __n;
  long *in_RDI;
  bool bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  PreCalc<float> *pc_1;
  int ix;
  int iy;
  float output_val;
  int pw_1;
  int ph_1;
  int pre_calc_index_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc_1;
  float count;
  int roi_bin_grid_w_1;
  int roi_bin_grid_h_1;
  PreCalc<float> *pc;
  int bx;
  int by;
  float sum;
  int area;
  bool is_empty;
  int bin_grid_w;
  int bin_grid_h;
  float wend;
  float hend;
  float wstart;
  float hstart;
  int pw;
  int ph;
  int pre_calc_index;
  float *outptr;
  float *ptr;
  int q;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  int roi_bin_grid_w;
  int roi_bin_grid_h;
  float bin_size_h;
  float bin_size_w;
  float roi_height;
  float roi_width;
  float roi_end_h;
  float roi_end_w;
  float roi_start_h;
  float roi_start_w;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int height;
  int width;
  Mat *bottom_blob;
  Mat *m_2;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffff8d0;
  size_type in_stack_fffffffffffff8d8;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  float local_6d0;
  float local_6cc;
  float local_6c8;
  bool local_6c1;
  float local_6bc;
  float local_6b4;
  undefined8 in_stack_fffffffffffff950;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined8 in_stack_fffffffffffff968;
  undefined8 in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  int iVar15;
  undefined8 in_stack_fffffffffffff980;
  int in_stack_fffffffffffff988;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *in_stack_fffffffffffff990;
  float local_610;
  float local_60c;
  int local_5e8;
  int local_5e4;
  float local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined4 local_5b8;
  Allocator *local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined8 local_590;
  void *local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  Allocator *local_560;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined8 local_540;
  void *local_538;
  int local_530;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> local_528;
  int local_50c;
  int local_508;
  float local_504;
  int local_500;
  int local_4fc;
  reference local_4f8;
  int local_4f0;
  int local_4ec;
  float local_4e8;
  int local_4e4;
  bool local_4dd;
  int local_4dc;
  int local_4d8;
  float local_4d4;
  float local_4d0;
  float local_4cc;
  float local_4c8;
  float local_4c4;
  float local_4c0;
  float local_4bc;
  float local_4b8;
  float local_4b4;
  float local_4b0;
  float local_4ac;
  float local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined4 local_480;
  Allocator *local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  void *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined4 local_430;
  Allocator *local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined8 local_408;
  void *local_400;
  int local_3f8;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> local_3e0;
  int local_3c8;
  int local_3c4;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float *local_398;
  reference local_390;
  const_reference local_388;
  int local_37c;
  size_t local_378;
  int local_370;
  int local_36c;
  const_reference local_368;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_358;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_350;
  int local_33c;
  reference local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  const_reference local_320;
  undefined1 local_315;
  int local_314;
  const_reference local_310;
  undefined8 *local_308;
  undefined1 local_2fd;
  int local_2fc;
  const_reference local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2d8;
  undefined8 *local_2c8;
  undefined8 *local_2b8;
  allocator_type *local_2a8;
  undefined1 local_295;
  int local_294;
  reference local_290;
  undefined8 *local_288;
  undefined1 local_275;
  int local_274;
  reference local_270;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_250;
  reference local_248;
  Allocator *local_240;
  int local_234;
  size_t local_230;
  void *local_228;
  int local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  Allocator *local_208;
  int local_1fc;
  size_t local_1f8;
  void *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  Allocator *local_1d0;
  int local_1c4;
  size_t local_1c0;
  void *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  Allocator *local_198;
  int local_18c;
  size_t local_188;
  void *local_180;
  int local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  allocator_type *local_e8;
  undefined8 *local_c8;
  undefined8 *local_a8;
  undefined8 *local_88;
  
  local_358 = in_RDX;
  local_350 = in_RSI;
  local_368 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_36c = local_368->w;
  local_370 = local_368->h;
  local_378 = local_368->elemsize;
  local_37c = local_368->c;
  local_388 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_350,1);
  local_390 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_358,0);
  Mat::create(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
              (int)in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
              in_stack_fffffffffffff8d8,(Allocator *)in_stack_fffffffffffff8d0);
  local_338 = local_390;
  bVar4 = true;
  if (local_390->data != (void *)0x0) {
    local_248 = local_390;
    bVar4 = local_390->cstep * (long)local_390->c == 0;
  }
  if (bVar4) {
    local_33c = -100;
  }
  else {
    local_320 = local_388;
    local_398 = (float *)local_388->data;
    local_39c = *local_398 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_3a0 = local_398[1] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_3a4 = local_398[2] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_3a8 = local_398[3] * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) & 1) != 0) {
      local_39c = local_39c - 0.5;
      local_3a0 = local_3a0 - 0.5;
      local_3a4 = local_3a4 - 0.5;
      local_3a8 = local_3a8 - 0.5;
    }
    local_3ac = local_3a4 - local_39c;
    local_3b0 = local_3a8 - local_3a0;
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) & 1) == 0) {
      local_3b4 = 1.0;
      pfVar1 = std::max<float>(&local_3ac,&local_3b4);
      local_3ac = *pfVar1;
      local_3b8 = 1.0;
      pfVar1 = std::max<float>(&local_3b0,&local_3b8);
      local_3b0 = *pfVar1;
    }
    local_3bc = local_3ac / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_3c0 = local_3b0 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar6._0_4_ = local_3b0 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
        ;
        auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar5 = std::ceil(auVar6._0_8_);
        local_60c = SUB84(dVar5,0);
      }
      else {
        local_60c = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      iVar15 = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
      local_3c4 = (int)local_60c;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar7._0_4_ = local_3ac / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
        ;
        auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar5 = std::ceil(auVar7._0_8_);
        local_610 = SUB84(dVar5,0);
      }
      else {
        local_610 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      local_3c8 = (int)local_610;
      std::allocator<ncnn::PreCalc<float>_>::allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x1a2d801);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::allocator<ncnn::PreCalc<float>_>::~allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x1a2d82d);
      auVar10 = ZEXT464(0);
      original_pre_calc_for_bilinear_interpolate<float>
                ((int)((ulong)in_stack_fffffffffffff980 >> 0x20),(int)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(int)in_stack_fffffffffffff978,
                 (float)((ulong)in_stack_fffffffffffff970 >> 0x20),(float)in_stack_fffffffffffff970,
                 (float)((ulong)in_stack_fffffffffffff968 >> 0x20),(float)in_stack_fffffffffffff968,
                 iVar15,in_stack_fffffffffffff958);
      for (local_3f8 = 0; local_3f8 < local_37c; local_3f8 = local_3f8 + 1) {
        local_2f0 = &local_448;
        local_1a4 = local_368->w;
        local_1a8 = local_368->h;
        local_1ac = local_368->d;
        local_400 = (void *)((long)local_368->data +
                            local_368->cstep * (long)local_3f8 * local_368->elemsize);
        local_1c0 = local_368->elemsize;
        local_1c4 = local_368->elempack;
        local_1d0 = local_368->allocator;
        local_1a0 = &local_448;
        local_148 = (long)local_1a4 * (long)local_1a8 * local_1c0;
        local_328 = &local_448;
        local_2d8 = &local_448;
        local_268 = &local_498;
        local_214 = local_390->w;
        local_218 = local_390->h;
        local_21c = local_390->d;
        local_450 = (void *)((long)local_390->data +
                            local_390->cstep * (long)local_3f8 * local_390->elemsize);
        local_230 = local_390->elemsize;
        local_234 = local_390->elempack;
        local_240 = local_390->allocator;
        local_210 = &local_498;
        local_128 = (long)local_214 * (long)local_218 * local_230;
        local_250 = &local_498;
        local_2c8 = &local_498;
        local_410 = 0;
        local_414 = 0;
        local_418 = 0;
        local_41c = 0;
        local_430 = 0;
        local_438 = 0;
        local_440 = 0;
        local_448 = 0;
        local_12c = 0x10;
        local_14c = 0x10;
        local_270 = local_390;
        local_274 = local_3f8;
        local_275 = 1;
        local_2f8 = local_368;
        local_2fc = local_3f8;
        local_2fd = 1;
        local_408 = 0;
        local_420 = 0;
        local_498 = 0;
        local_488 = 0;
        local_480 = 0;
        local_470 = 0;
        local_46c = 0;
        local_468 = 0;
        local_464 = 0;
        local_460 = 0;
        local_458 = 0;
        local_490 = 0;
        local_49c = 0;
        local_228 = local_450;
        local_1b8 = local_400;
        local_a8 = local_2c8;
        local_88 = local_2d8;
        local_478 = local_240;
        local_428 = local_1d0;
        for (local_4a0 = 0; local_4a0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_4a0 = local_4a0 + 1) {
          for (local_4a4 = 0; local_4a4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
              ; local_4a4 = local_4a4 + 1) {
            auVar11._0_4_ = (float)local_4a0;
            auVar11._4_12_ = auVar10._4_12_;
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_3c0),auVar11,ZEXT416((uint)local_3a0));
            local_4a8 = auVar8._0_4_;
            auVar12._0_4_ = (float)local_4a4;
            auVar12._4_12_ = auVar8._4_12_;
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_3bc),auVar12,ZEXT416((uint)local_39c));
            local_4ac = auVar8._0_4_;
            auVar13._0_4_ = (float)(local_4a0 + 1);
            auVar13._4_12_ = auVar8._4_12_;
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_3c0),auVar13,ZEXT416((uint)local_3a0));
            local_4b0 = auVar8._0_4_;
            auVar14._0_4_ = (float)(local_4a4 + 1);
            auVar14._4_12_ = auVar8._4_12_;
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_3bc),auVar14,ZEXT416((uint)local_39c));
            local_4b4 = auVar8._0_4_;
            local_4b8 = 0.0;
            pfVar1 = std::max<float>(&local_4a8,&local_4b8);
            local_4bc = (float)local_370;
            pfVar1 = std::min<float>(pfVar1,&local_4bc);
            local_4a8 = *pfVar1;
            local_4c0 = 0.0;
            pfVar1 = std::max<float>(&local_4ac,&local_4c0);
            local_4c4 = (float)local_36c;
            pfVar1 = std::min<float>(pfVar1,&local_4c4);
            local_4ac = *pfVar1;
            local_4c8 = 0.0;
            pfVar1 = std::max<float>(&local_4b0,&local_4c8);
            local_4cc = (float)local_370;
            pfVar1 = std::min<float>(pfVar1,&local_4cc);
            local_4b0 = *pfVar1;
            local_4d0 = 0.0;
            pfVar1 = std::max<float>(&local_4b4,&local_4d0);
            local_4d4 = (float)local_36c;
            pfVar1 = std::min<float>(pfVar1,&local_4d4);
            local_4b4 = *pfVar1;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
              dVar5 = std::ceil((double)(ulong)(uint)(local_4b0 - local_4a8));
              local_6b4 = SUB84(dVar5,0);
            }
            else {
              local_6b4 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            }
            local_4d8 = (int)local_6b4;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
              dVar5 = std::ceil((double)(ulong)(uint)(local_4b4 - local_4ac));
              local_6bc = SUB84(dVar5,0);
            }
            else {
              local_6bc = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            }
            local_4dc = (int)local_6bc;
            local_6c1 = local_4b0 <= local_4a8 || local_4b4 <= local_4ac;
            local_4dd = local_6c1;
            local_4e4 = local_4d8 * local_4dc;
            local_4e8 = 0.0;
            for (local_4ec = 0; local_4ec < local_4d8; local_4ec = local_4ec + 1) {
              for (local_4f0 = 0; local_4f0 < local_4dc; local_4f0 = local_4f0 + 1) {
                __n = (size_type)local_49c;
                local_49c = local_49c + 1;
                local_4f8 = std::
                            vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                            operator[](&local_3e0,__n);
                local_4e8 = local_4f8->w1 * *(float *)((long)local_400 + (long)local_4f8->pos1 * 4)
                            + local_4f8->w2 *
                              *(float *)((long)local_400 + (long)local_4f8->pos2 * 4) +
                            local_4f8->w3 * *(float *)((long)local_400 + (long)local_4f8->pos3 * 4)
                            + local_4f8->w4 *
                              *(float *)((long)local_400 + (long)local_4f8->pos4 * 4) + local_4e8;
              }
            }
            if ((local_4dd & 1U) == 0) {
              local_6c8 = local_4e8 / (float)local_4e4;
            }
            else {
              local_6c8 = 0.0;
            }
            auVar10 = ZEXT464((uint)local_6c8);
            *(float *)((long)local_450 + (long)local_4a4 * 4) = local_6c8;
          }
          local_450 = (void *)((long)local_450 +
                              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * 4);
        }
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 in_stack_fffffffffffff8d0);
    }
    else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar8._0_4_ = local_3b0 / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
        ;
        auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar5 = std::ceil(auVar8._0_8_);
        local_6cc = SUB84(dVar5,0);
      }
      else {
        local_6cc = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      iVar15 = (int)in_stack_fffffffffffff980;
      local_4fc = (int)local_6cc;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) < 1) {
        auVar9._0_4_ = local_3ac / (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
        ;
        auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
        dVar5 = std::ceil(auVar9._0_8_);
        local_6d0 = SUB84(dVar5,0);
      }
      else {
        local_6d0 = (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      }
      local_500 = (int)local_6d0;
      local_508 = local_4fc * local_500;
      local_50c = 1;
      piVar2 = std::max<int>(&local_508,&local_50c);
      local_504 = (float)*piVar2;
      std::allocator<ncnn::PreCalc<float>_>::allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x1a2e9de);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::allocator<ncnn::PreCalc<float>_>::~allocator
                ((allocator<ncnn::PreCalc<float>_> *)0x1a2ea04);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)((ulong)in_stack_fffffffffffff970 >> 0x20),(int)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(int)in_stack_fffffffffffff968,
                 (int)((ulong)in_stack_fffffffffffff960 >> 0x20),(int)in_stack_fffffffffffff960,
                 (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 SUB84(in_stack_fffffffffffff958,0),
                 (float)((ulong)in_stack_fffffffffffff950 >> 0x20),(float)in_stack_fffffffffffff950,
                 iVar15,in_stack_fffffffffffff988,in_stack_fffffffffffff990);
      for (local_530 = 0; local_530 < local_37c; local_530 = local_530 + 1) {
        local_308 = &local_580;
        local_16c = local_368->w;
        local_170 = local_368->h;
        local_174 = local_368->d;
        local_538 = (void *)((long)local_368->data +
                            local_368->cstep * (long)local_530 * local_368->elemsize);
        local_188 = local_368->elemsize;
        local_18c = local_368->elempack;
        local_198 = local_368->allocator;
        local_168 = &local_580;
        local_158 = (long)local_16c * (long)local_170 * local_188;
        local_330 = &local_580;
        local_2b8 = &local_580;
        local_288 = &local_5d0;
        local_1dc = local_390->w;
        local_1e0 = local_390->h;
        local_1e4 = local_390->d;
        local_588 = (void *)((long)local_390->data +
                            local_390->cstep * (long)local_530 * local_390->elemsize);
        local_1f8 = local_390->elemsize;
        local_1fc = local_390->elempack;
        local_208 = local_390->allocator;
        local_1d8 = &local_5d0;
        local_138 = (long)local_1dc * (long)local_1e0 * local_1f8;
        local_258 = &local_5d0;
        in_stack_fffffffffffff8d0 = (allocator_type *)&local_5d0;
        local_548 = 0;
        local_54c = 0;
        local_550 = 0;
        local_554 = 0;
        local_568 = 0;
        local_570 = 0;
        local_578 = 0;
        local_580 = 0;
        local_13c = 0x10;
        local_15c = 0x10;
        local_290 = local_390;
        local_294 = local_530;
        local_295 = 1;
        local_310 = local_368;
        local_314 = local_530;
        local_315 = 1;
        local_540 = 0;
        local_558 = 0;
        local_5d0 = 0;
        local_5c0 = 0;
        local_5b8 = 0;
        local_5a8 = 0;
        local_5a4 = 0;
        local_5a0 = 0;
        local_59c = 0;
        local_598 = 0;
        local_590 = 0;
        local_5c8 = 0;
        local_5d4 = 0;
        local_2a8 = in_stack_fffffffffffff8d0;
        local_1f0 = local_588;
        local_180 = local_538;
        local_e8 = in_stack_fffffffffffff8d0;
        local_c8 = local_2b8;
        local_5b0 = local_208;
        local_560 = local_198;
        for (local_5d8 = 0; local_5d8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_5d8 = local_5d8 + 1) {
          for (local_5dc = 0; local_5dc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
              ; local_5dc = local_5dc + 1) {
            local_5e0 = 0.0;
            for (local_5e4 = 0; local_5e4 < local_4fc; local_5e4 = local_5e4 + 1) {
              for (local_5e8 = 0; local_5e8 < local_500; local_5e8 = local_5e8 + 1) {
                pvVar3 = std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                         operator[](&local_528,(long)local_5d4);
                local_5e0 = pvVar3->w1 * *(float *)((long)local_538 + (long)pvVar3->pos1 * 4) +
                            pvVar3->w2 * *(float *)((long)local_538 + (long)pvVar3->pos2 * 4) +
                            pvVar3->w3 * *(float *)((long)local_538 + (long)pvVar3->pos3 * 4) +
                            pvVar3->w4 * *(float *)((long)local_538 + (long)pvVar3->pos4 * 4) +
                            local_5e0;
                local_5d4 = local_5d4 + 1;
              }
            }
            *(float *)((long)local_588 + (long)local_5dc * 4) = local_5e0 / local_504;
          }
          local_588 = (void *)((long)local_588 +
                              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * 4);
        }
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~vector
                ((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *)
                 in_stack_fffffffffffff8d0);
    }
    local_33c = 0;
  }
  return local_33c;
}

Assistant:

int ROIAlign_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}